

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane-test.c++
# Opt level: O0

Promise<void> __thiscall
capnp::_::anon_unknown_0::TestMembraneImpl::callPassThrough
          (TestMembraneImpl *this,CallPassThroughContext context)

{
  RequestHook **__return_storage_ptr__;
  bool bVar1;
  size_t in_RCX;
  TestMembraneImpl *in_RDX;
  void *__buf;
  PromiseNode *extraout_RDX;
  int in_R8D;
  Promise<void> PVar2;
  TestMembraneImpl *local_108;
  Request<capnproto_test::capnp::test::TestMembrane::Thing::PassThroughParams,_capnproto_test::capnp::test::TestMembrane::Result>
  local_100;
  undefined4 local_c8;
  Maybe<capnp::MessageSize> local_b8;
  Client local_a0;
  undefined1 local_88 [8];
  Request<capnproto_test::capnp::test::TestMembrane::Thing::PassThroughParams,_capnproto_test::capnp::test::TestMembrane::Result>
  req;
  Reader params;
  TestMembraneImpl *this_local;
  CallPassThroughContext context_local;
  
  __return_storage_ptr__ = &req.hook.ptr;
  this_local = in_RDX;
  context_local.hook = (CallContextHook *)this;
  CallContext<capnproto_test::capnp::test::TestMembrane::CallPassThroughParams,_capnproto_test::capnp::test::TestMembrane::Result>
  ::getParams((Reader *)__return_storage_ptr__,
              (CallContext<capnproto_test::capnp::test::TestMembrane::CallPassThroughParams,_capnproto_test::capnp::test::TestMembrane::Result>
               *)&this_local);
  capnproto_test::capnp::test::TestMembrane::CallPassThroughParams::Reader::getThing
            (&local_a0,(Reader *)__return_storage_ptr__);
  kj::Maybe<capnp::MessageSize>::Maybe(&local_b8,(void *)0x0);
  capnproto_test::capnp::test::TestMembrane::Thing::Client::passThroughRequest
            ((Request<capnproto_test::capnp::test::TestMembrane::Thing::PassThroughParams,_capnproto_test::capnp::test::TestMembrane::Result>
              *)local_88,&local_a0,&local_b8);
  kj::Maybe<capnp::MessageSize>::~Maybe(&local_b8);
  capnproto_test::capnp::test::TestMembrane::Thing::Client::~Client(&local_a0);
  bVar1 = capnproto_test::capnp::test::TestMembrane::CallPassThroughParams::Reader::getTailCall
                    ((Reader *)&req.hook.ptr);
  if (bVar1) {
    kj::
    mv<capnp::Request<capnproto_test::capnp::test::TestMembrane::Thing::PassThroughParams,capnproto_test::capnp::test::TestMembrane::Result>>
              ((Request<capnproto_test::capnp::test::TestMembrane::Thing::PassThroughParams,_capnproto_test::capnp::test::TestMembrane::Result>
                *)local_88);
    CallContext<capnproto_test::capnp::test::TestMembrane::CallPassThroughParams,_capnproto_test::capnp::test::TestMembrane::Result>
    ::tailCall<capnproto_test::capnp::test::TestMembrane::Thing::PassThroughParams>
              ((CallContext<capnproto_test::capnp::test::TestMembrane::CallPassThroughParams,_capnproto_test::capnp::test::TestMembrane::Result>
                *)this,(Request<capnproto_test::capnp::test::TestMembrane::Thing::PassThroughParams,_capnproto_test::capnp::test::TestMembrane::Result>
                        *)&this_local);
  }
  else {
    Request<capnproto_test::capnp::test::TestMembrane::Thing::PassThroughParams,_capnproto_test::capnp::test::TestMembrane::Result>
    ::send(&local_100,(int)local_88,__buf,in_RCX,in_R8D);
    local_108 = this_local;
    kj::Promise<capnp::Response<capnproto_test::capnp::test::TestMembrane::Result>>::
    then<capnp::_::(anonymous_namespace)::TestMembraneImpl::callPassThrough(capnp::CallContext<capnproto_test::capnp::test::TestMembrane::CallPassThroughParams,capnproto_test::capnp::test::TestMembrane::Result>)::_lambda(capnp::Response<capnproto_test::capnp::test::TestMembrane::Result>&&)_1_,kj::_::PropagateException>
              ((Promise<capnp::Response<capnproto_test::capnp::test::TestMembrane::Result>> *)this,
               (Type *)&local_100,(PropagateException *)&local_108);
    RemotePromise<capnproto_test::capnp::test::TestMembrane::Result>::~RemotePromise
              ((RemotePromise<capnproto_test::capnp::test::TestMembrane::Result> *)&local_100);
  }
  local_c8 = 1;
  Request<capnproto_test::capnp::test::TestMembrane::Thing::PassThroughParams,_capnproto_test::capnp::test::TestMembrane::Result>
  ::~Request((Request<capnproto_test::capnp::test::TestMembrane::Thing::PassThroughParams,_capnproto_test::capnp::test::TestMembrane::Result>
              *)local_88);
  PVar2.super_PromiseBase.node.ptr = extraout_RDX;
  PVar2.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar2.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> callPassThrough(CallPassThroughContext context) override {
    auto params = context.getParams();
    auto req = params.getThing().passThroughRequest();
    if (params.getTailCall()) {
      return context.tailCall(kj::mv(req));
    } else {
      return req.send().then(
          [KJ_CPCAP(context)](Response<test::TestMembrane::Result>&& result) mutable {
        context.setResults(result);
      });
    }